

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_>::createMeshAccel
          (BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_> *this,size_t geomID,
          Builder **builder)

{
  QuadMesh *pQVar1;
  BVHN<4> *this_00;
  undefined8 *puVar2;
  QuadMesh *mesh;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  this_00 = (BVHN<4> *)alignedMalloc(0x240,0x10);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&QuadMv<4>::type,*(Scene **)(this + 0x30));
  *(BVHN<4> **)(*(long *)(*(long *)(this + 0x28) + 0x200) + geomID * 8) = this_00;
  pQVar1 = *(QuadMesh **)(*(long *)(*(long *)(this + 0x30) + 0x1e8) + geomID * 8);
  mesh = (QuadMesh *)0x0;
  if ((pQVar1 != (QuadMesh *)0x0) && (*(char *)&(pQVar1->super_Geometry).field_8 == '\x15')) {
    mesh = pQVar1;
  }
  if (mesh != (QuadMesh *)0x0) {
    __internal_two_level_builder__::MeshBuilder<4,_embree::QuadMesh,_embree::QuadMv<4>_>::operator()
              ((MeshBuilder<4,_embree::QuadMesh,_embree::QuadMv<4>_> *)&local_48,
               *(void **)(*(long *)(*(long *)(this + 0x28) + 0x200) + geomID * 8),mesh,geomID,
               *(GTypeMask *)(this + 0x98),(bool)this[0xa0],builder);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"geomID does not return correct type","");
  *puVar2 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar2 + 1) = 2;
  puVar2[2] = puVar2 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_48,local_48 + local_40);
  __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void createMeshAccel (size_t geomID, Builder*& builder)
      {
        bvh->objects[geomID] = new BVH(Primitive::type,scene);
        BVH* accel = bvh->objects[geomID];
        auto mesh = scene->getSafe<Mesh>(geomID);
        if (nullptr == mesh) {
          throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"geomID does not return correct type");
          return;
        }

        __internal_two_level_builder__::MeshBuilder<N,Mesh,Primitive>()(accel, mesh, geomID, this->gtype, this->useMortonBuilder_, builder);
      }